

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall
wasm::MultiMemoryLowering::MultiMemoryLowering(MultiMemoryLowering *this,bool checkBounds)

{
  bool checkBounds_local;
  MultiMemoryLowering *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__MultiMemoryLowering_0309dcb8;
  this->wasm = (Module *)0x0;
  wasm::Name::Name(&this->combinedMemory);
  wasm::Type::Type(&this->pointerType);
  this->isExported = false;
  wasm::Name::Name(&this->module);
  wasm::Name::Name(&this->base);
  wasm::Address::Address(&this->totalInitialPages);
  wasm::Address::Address(&this->totalMaxPages);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&this->offsetGlobalNames);
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::unordered_map(&this->memoryIdxMap);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&this->memorySizeNames);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&this->memoryGrowNames);
  this->checkBounds = checkBounds;
  return;
}

Assistant:

MultiMemoryLowering(bool checkBounds) : checkBounds(checkBounds) {}